

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O2

path * __thiscall Omega_h::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  long lVar1;
  string sStack_38;
  
  lVar1 = std::__cxx11::string::rfind((char)this,0x2f);
  if (lVar1 == -1) {
    path(__return_storage_ptr__,&this->impl);
  }
  else {
    std::__cxx11::string::substr((ulong)&sStack_38,(ulong)this);
    path(__return_storage_ptr__,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::filename() const {
  auto const last_sep_pos = impl.find_last_of(preferred_separator);
  if (last_sep_pos == std::string::npos) return impl;
  return impl.substr(last_sep_pos + 1, std::string::npos);
}